

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O2

Result __thiscall
wabt::interp::anon_unknown_0::BinaryReaderInterp::OnElseExpr(BinaryReaderInterp *this)

{
  Offset fixup_offset;
  Result RVar1;
  Offset OVar2;
  Label *pLVar3;
  
  RVar1 = SharedValidator::OnElse
                    (&this->validator_,(Location *)(anonymous_namespace)::BinaryReaderInterp::loc);
  if (RVar1.enum_ != Error) {
    pLVar3 = TopLabel(this);
    fixup_offset = pLVar3->fixup_offset;
    Istream::Emit(this->istream_,Br);
    OVar2 = Istream::EmitFixupU32(this->istream_);
    pLVar3->fixup_offset = OVar2;
    Istream::ResolveFixupU32(this->istream_,fixup_offset);
  }
  return (Result)(uint)(RVar1.enum_ == Error);
}

Assistant:

Result BinaryReaderInterp::OnElseExpr() {
  CHECK_RESULT(validator_.OnElse(loc));
  Label* label = TopLabel();
  Istream::Offset fixup_cond_offset = label->fixup_offset;
  istream_.Emit(Opcode::Br);
  label->fixup_offset = istream_.EmitFixupU32();
  istream_.ResolveFixupU32(fixup_cond_offset);
  return Result::Ok;
}